

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_error_code.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::signal_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int ev)

{
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25;
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d;
  int local_1c;
  void *pvStack_18;
  int ev_local;
  signal_error_category *this_local;
  
  local_1c = ev;
  pvStack_18 = this;
  this_local = (signal_error_category *)__return_storage_ptr__;
  switch(ev) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"hangup",&local_20);
    std::allocator<char>::~allocator(&local_20);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"interrupt",&local_22);
    std::allocator<char>::~allocator(&local_22);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"quit",&local_25);
    std::allocator<char>::~allocator(&local_25);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"illegal",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"trap",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"abort",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bus",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"arithmetic_exception",&local_1f);
    std::allocator<char>::~allocator(&local_1f);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"kill",&local_23);
    std::allocator<char>::~allocator(&local_23);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"user1",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"segmentation fault",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"user2",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pipe",&local_24);
    std::allocator<char>::~allocator(&local_24);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"alarm",&local_1e);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminate",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unknown",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"child",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"cont",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"stop",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminal_stop",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0x15:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminal_in",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0x16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminal_out",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"urgent_data",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case 0x18:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"cpu_limit",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case 0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"file_size_limit",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case 0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"virtual_timer",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case 0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"profiler",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case 0x1d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"poll",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 0x1f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"system_call",&local_33);
    std::allocator<char>::~allocator(&local_33);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const noexcept override
		{
#define SIGNAL_CASE(x) case sig::errors::error_code_enum:: x: return #x;
			switch (ev)
			{
			SIGNAL_CASE(abort)
			SIGNAL_CASE(alarm)
			SIGNAL_CASE(arithmetic_exception)
			SIGNAL_CASE(hangup)
			SIGNAL_CASE(illegal)
			SIGNAL_CASE(interrupt)
			SIGNAL_CASE(kill)
			SIGNAL_CASE(pipe)
			SIGNAL_CASE(quit)
			case sig::errors::error_code_enum::segmentation: return "segmentation fault";
			SIGNAL_CASE(terminate)
			SIGNAL_CASE(user1)
			SIGNAL_CASE(user2)
			SIGNAL_CASE(child)
			SIGNAL_CASE(cont)
			SIGNAL_CASE(stop)
			SIGNAL_CASE(terminal_stop)
			SIGNAL_CASE(terminal_in)
			SIGNAL_CASE(terminal_out)
			SIGNAL_CASE(bus)
#ifdef SIGPOLL
			SIGNAL_CASE(poll)
#endif
			SIGNAL_CASE(profiler)
			SIGNAL_CASE(system_call)
			SIGNAL_CASE(trap)
			SIGNAL_CASE(urgent_data)
			SIGNAL_CASE(virtual_timer)
			SIGNAL_CASE(cpu_limit)
			SIGNAL_CASE(file_size_limit)
			default: return "unknown";
			}
#undef SIGNAL_CASE
		}